

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunningSection::~RunningSection(RunningSection *this)

{
  long in_RDI;
  vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_> *unaff_retaddr;
  
  deleteAll<std::vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>>>
            ((vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_> *)this);
  std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::~vector
            (unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  return;
}

Assistant:

~RunningSection() {
            deleteAll( m_subSections );
        }